

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

void __thiscall
QFontCache::insertEngine(QFontCache *this,Key *key,QFontEngine *engine,bool insertMulti)

{
  int iVar1;
  QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
  *pQVar2;
  int *piVar3;
  long in_FS_OFFSET;
  Engine local_38;
  QFontEngine *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  LOCK();
  (engine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (engine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_28 = engine;
  if (((0x2000 < this->total_cost) &&
      (pQVar2 = (this->engineCache).d.d.ptr,
      pQVar2 != (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0)) &&
     (0xff < (long)(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
    decreaseCache(this);
  }
  local_38.data = local_28;
  local_38.hits = 0;
  local_38.timestamp = this->current_timestamp + 1;
  this->current_timestamp = local_38.timestamp;
  if (insertMulti) {
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::insert(&this->engineCache,key,&local_38);
  }
  else {
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::replace(&this->engineCache,key,&local_38);
  }
  piVar3 = QHash<QFontEngine_*,_int>::operator[](&this->engineCacheCount,&local_28);
  iVar1 = *piVar3;
  *piVar3 = iVar1 + 1;
  if (iVar1 == 0) {
    increaseCost(this,local_28->cache_cost);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontCache::insertEngine(const Key &key, QFontEngine *engine, bool insertMulti)
{
    Q_ASSERT(engine != nullptr);
    Q_ASSERT(key.multi == (engine->type() == QFontEngine::Multi));

#ifdef QFONTCACHE_DEBUG
    FC_DEBUG("QFontCache: inserting new engine %p, refcount %d", engine, engine->ref.loadRelaxed());
    if (!insertMulti && engineCache.contains(key)) {
        FC_DEBUG("   QFontCache already contains engine %p for key=(%g %g %d %d %d)",
                 engineCache.value(key).data, key.def.pointSize,
                 key.def.pixelSize, key.def.weight, key.def.style, key.def.fixedPitch);
    }
#endif
    engine->ref.ref();
    // Decrease now rather than waiting
    if (total_cost > min_cost * 2 && engineCache.size() >= QFONTCACHE_DECREASE_TRIGGER_LIMIT)
        decreaseCache();

    Engine data(engine);
    data.timestamp = ++current_timestamp;

    if (insertMulti)
        engineCache.insert(key, data);
    else
        engineCache.replace(key, data);
    // only increase the cost if this is the first time we insert the engine
    if (++engineCacheCount[engine] == 1)
        increaseCost(engine->cache_cost);
}